

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void init_gm_sf(GLOBAL_MOTION_SPEED_FEATURES *gm_sf)

{
  GLOBAL_MOTION_SPEED_FEATURES *gm_sf_local;
  
  gm_sf->gm_search_type = '\0';
  gm_sf->prune_ref_frame_for_gm_search = 0;
  gm_sf->prune_zero_mv_with_sse = 0;
  gm_sf->disable_gm_search_based_on_stats = 0;
  gm_sf->downsample_level = 0;
  gm_sf->num_refinement_steps = 5;
  gm_sf->gm_erroradv_tr_level = 0;
  return;
}

Assistant:

static inline void init_gm_sf(GLOBAL_MOTION_SPEED_FEATURES *gm_sf) {
  gm_sf->gm_search_type = GM_FULL_SEARCH;
  gm_sf->prune_ref_frame_for_gm_search = 0;
  gm_sf->prune_zero_mv_with_sse = 0;
  gm_sf->disable_gm_search_based_on_stats = 0;
  gm_sf->downsample_level = 0;
  gm_sf->num_refinement_steps = GM_MAX_REFINEMENT_STEPS;
  gm_sf->gm_erroradv_tr_level = 0;
}